

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svrg.cc
# Opt level: O0

void SVRG::save_load(svrg *s,io_buf *model_file,bool read,bool text)

{
  bool bVar1;
  size_t sVar2;
  ostream *this;
  vw *all;
  byte in_CL;
  uint uVar3;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  stringstream msg;
  gd *in_stack_000000f8;
  bool in_stack_00000106;
  bool in_stack_00000107;
  io_buf *in_stack_00000108;
  vw *in_stack_00000110;
  bool resume;
  undefined4 in_stack_fffffffffffffe3c;
  undefined1 text_00;
  stringstream *in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe5f;
  char *in_stack_fffffffffffffe60;
  size_t in_stack_fffffffffffffe68;
  _func_int **in_stack_fffffffffffffe70;
  io_buf *in_stack_fffffffffffffe78;
  
  if ((in_DL & 1) != 0) {
    initialize_regressor((vw *)0x2cf5e9);
  }
  sVar2 = v_array<int>::size((v_array<int> *)(in_RSI + 0x30));
  if (sVar2 != 0) {
    bVar1 = (bool)(*(byte *)(*(long *)(in_RDI + 0x10) + 0x9e) & 1);
    std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe60);
    this = std::operator<<((ostream *)&stack0xfffffffffffffe70,":");
    all = (vw *)std::ostream::operator<<(this,bVar1);
    text_00 = (undefined1)((ulong)this >> 0x38);
    std::operator<<((ostream *)all,"\n");
    uVar3 = (uint)(in_CL & 1);
    bin_text_read_write_fixed
              (in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68
               ,in_stack_fffffffffffffe60,(bool)in_stack_fffffffffffffe5f,in_stack_fffffffffffffe50,
               (bool)text_00);
    if (bVar1 == false) {
      GD::save_load_regressor(all,(io_buf *)CONCAT44(in_stack_fffffffffffffe3c,uVar3),false,false);
    }
    else {
      GD::save_load_online_state
                (in_stack_00000110,in_stack_00000108,in_stack_00000107,in_stack_00000106,
                 in_stack_000000f8);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe60);
  }
  return;
}

Assistant:

void save_load(svrg& s, io_buf& model_file, bool read, bool text)
{
  if (read)
  {
    initialize_regressor(*s.all);
  }

  if (model_file.files.size() > 0)
  {
    bool resume = s.all->save_resume;
    stringstream msg;
    msg << ":" << resume << "\n";
    bin_text_read_write_fixed(model_file, (char*)&resume, sizeof(resume), "", read, msg, text);

    if (resume)
      GD::save_load_online_state(*s.all, model_file, read, text);
    else
      GD::save_load_regressor(*s.all, model_file, read, text);
  }
}